

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O1

void __thiscall
t_javame_generator::generate_java_struct
          (t_javame_generator *this,t_struct *tstruct,bool is_exception)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  ostream *poVar4;
  _Alloc_hider *p_Var5;
  long *plVar6;
  t_javame_generator *ptVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_struct_name;
  ofstream_with_content_based_conditional_update f_struct;
  char *local_270;
  long local_268;
  char local_260 [16];
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  undefined1 local_230 [32];
  string local_210;
  undefined1 local_1f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  pcVar1 = (this->package_dir_)._M_dataplus._M_p;
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar1,pcVar1 + (this->package_dir_)._M_string_length);
  std::__cxx11::string::append((char *)&local_270);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_270,*(ulong *)CONCAT44(extraout_var,iVar2));
  p_Var5 = (_Alloc_hider *)(plVar3 + 2);
  if ((_Alloc_hider *)*plVar3 == p_Var5) {
    local_1c0._M_p = p_Var5->_M_p;
    lStack_1b8 = plVar3[3];
    local_1d0._M_allocated_capacity = (size_type)&local_1c0;
  }
  else {
    local_1c0._M_p = p_Var5->_M_p;
    local_1d0._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar3;
  }
  local_1d0._8_8_ = plVar3[1];
  *plVar3 = (long)p_Var5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_1d0._M_local_buf);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_240 = *plVar6;
    lStack_238 = plVar3[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *plVar6;
    local_250 = (long *)*plVar3;
  }
  local_248 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((_Alloc_hider *)local_1d0._M_allocated_capacity != &local_1c0) {
    operator_delete((void *)local_1d0._M_allocated_capacity);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0);
  std::__cxx11::string::string((string *)&local_270,(char *)local_250,(allocator *)local_230);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0);
  local_140 = 0;
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_270,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1d0,local_270,local_268);
  java_package_abi_cxx11_((string *)local_230,this);
  ptVar7 = (t_javame_generator *)local_230._0_8_;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_230._0_8_,local_230._8_8_);
  java_type_imports_abi_cxx11_((string *)local_1f0,ptVar7);
  ptVar7 = (t_javame_generator *)local_1f0._0_8_;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_1f0._0_8_,local_1f0._8_8_);
  java_thrift_imports_abi_cxx11_(&local_210,ptVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((t_javame_generator *)local_1f0._0_8_ != (t_javame_generator *)(local_1f0 + 0x10)) {
    operator_delete((void *)local_1f0._0_8_);
  }
  if ((t_javame_generator *)local_230._0_8_ != (t_javame_generator *)(local_230 + 0x10)) {
    operator_delete((void *)local_230._0_8_);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  out = &local_1d0;
  generate_java_struct_definition(this,(ostream *)out,tstruct,is_exception,false,false);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0,(int)out);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  return;
}

Assistant:

void t_javame_generator::generate_java_struct(t_struct* tstruct, bool is_exception) {
  // Make output file
  string f_struct_name = package_dir_ + "/" + (tstruct->get_name()) + ".java";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << java_package() << java_type_imports() << java_thrift_imports();

  generate_java_struct_definition(f_struct, tstruct, is_exception);
  f_struct.close();
}